

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.cxx
# Opt level: O0

cmCTestGenericHandler * __thiscall cmCTestBuildCommand::InitializeHandler(cmCTestBuildCommand *this)

{
  cmMakefile *pcVar1;
  cmCTest *pcVar2;
  string *native;
  bool bVar3;
  ulong uVar4;
  cmake *gname;
  pointer pcVar5;
  ostream *poVar6;
  char *msg;
  string *psVar7;
  string *local_6d8;
  string *local_6a8;
  string *local_698;
  string *local_690;
  allocator<char> local_629;
  string local_628;
  cmValue local_608;
  cmValue labelsForSubprojects;
  string local_5f8;
  cmValue local_5d8;
  cmValue useLaunchers;
  undefined1 local_5b0 [8];
  ostringstream ostr;
  string local_438 [32];
  undefined1 local_418 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_2a0 [8];
  string buildCommand;
  string local_278;
  undefined1 local_258 [8];
  string dir;
  cmAlphaNum local_230;
  cmAlphaNum local_200;
  undefined1 local_1d0 [8];
  string e;
  string *local_188;
  byte local_17b;
  byte local_17a;
  allocator<char> local_179;
  string local_178;
  string_view local_158;
  string *local_148;
  string *cmakeBuildTarget;
  string local_138;
  string_view local_118;
  string *local_108;
  string *cmakeBuildAdditionalFlags;
  string_view local_f8;
  undefined1 local_e8 [8];
  string cmakeBuildConfiguration;
  string local_c0;
  cmValue local_a0;
  cmValue ctestBuildConfiguration;
  string local_90;
  cmValue local_70;
  cmValue cmakeGeneratorName;
  allocator<char> local_49;
  string local_48;
  cmValue local_28;
  cmValue ctestBuildCommand;
  cmCTestBuildHandler *handler;
  cmCTestBuildCommand *this_local;
  
  ctestBuildCommand.Value =
       (string *)
       cmCTest::GetBuildHandler((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
  (*(((cmCTestBuildHandler *)ctestBuildCommand.Value)->super_cmCTestGenericHandler).
    _vptr_cmCTestGenericHandler[3])();
  this->Handler = (cmCTestBuildHandler *)ctestBuildCommand.Value;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CTEST_BUILD_COMMAND",&local_49);
  local_28 = cmMakefile::GetDefinition(pcVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  cmakeGeneratorName.Value = local_28.Value;
  bVar3 = cmNonempty(local_28);
  if (bVar3) {
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    psVar7 = cmValue::operator*[abi_cxx11_(&local_28);
    cmCTest::SetCTestConfiguration
              (pcVar2,"MakeCommand",psVar7,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    goto LAB_00a3a878;
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"CTEST_CMAKE_GENERATOR",
             (allocator<char> *)((long)&ctestBuildConfiguration.Value + 7));
  local_70 = cmMakefile::GetDefinition(pcVar1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ctestBuildConfiguration.Value + 7));
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"CTEST_BUILD_CONFIGURATION",
             (allocator<char> *)(cmakeBuildConfiguration.field_2._M_local_buf + 0xf));
  local_a0 = cmMakefile::GetDefinition(pcVar1,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)(cmakeBuildConfiguration.field_2._M_local_buf + 0xf));
  local_f8 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view
                       ((string *)&this->Configuration);
  bVar3 = cmNonempty(local_f8);
  if (bVar3) {
    local_690 = &this->Configuration;
  }
  else {
    cmakeBuildAdditionalFlags = local_a0.Value;
    bVar3 = cmNonempty(local_a0);
    if (bVar3) {
      local_698 = cmValue::operator*[abi_cxx11_(&local_a0);
    }
    else {
      local_698 = cmCTest::GetConfigType_abi_cxx11_
                            ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
    }
    local_690 = local_698;
  }
  std::__cxx11::string::string((string *)local_e8,(string *)local_690);
  local_118 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->Flags);
  cmakeBuildTarget._6_1_ = 0;
  cmakeBuildTarget._5_1_ = 0;
  bVar3 = cmNonempty(local_118);
  if (bVar3) {
    local_6a8 = &this->Flags;
  }
  else {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    cmakeBuildTarget._6_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"CTEST_BUILD_FLAGS",
               (allocator<char> *)((long)&cmakeBuildTarget + 7));
    cmakeBuildTarget._5_1_ = 1;
    local_6a8 = cmMakefile::GetSafeDefinition(pcVar1,&local_138);
  }
  if ((cmakeBuildTarget._5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_138);
  }
  if ((cmakeBuildTarget._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&cmakeBuildTarget + 7));
  }
  local_108 = local_6a8;
  local_158 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->Target);
  local_17a = 0;
  local_17b = 0;
  bVar3 = cmNonempty(local_158);
  if (bVar3) {
    local_6d8 = &this->Target;
  }
  else {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    local_17a = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"CTEST_BUILD_TARGET",&local_179);
    local_17b = 1;
    local_6d8 = cmMakefile::GetSafeDefinition(pcVar1,&local_178);
  }
  if ((local_17b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_178);
  }
  if ((local_17a & 1) != 0) {
    std::allocator<char>::~allocator(&local_179);
  }
  local_148 = local_6d8;
  local_188 = local_70.Value;
  bVar3 = cmNonempty(local_70);
  if (bVar3) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      std::__cxx11::string::operator=((string *)local_e8,"Release");
    }
    bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->GlobalGenerator);
    if (bVar3) {
      pcVar5 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
               operator->(&this->GlobalGenerator);
      (*pcVar5->_vptr_cmGlobalGenerator[3])(&stack0xfffffffffffffe58);
      psVar7 = cmValue::operator*[abi_cxx11_(&local_70);
      bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &stack0xfffffffffffffe58,psVar7);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe58);
      if (bVar3) {
        std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::reset
                  (&this->GlobalGenerator,(pointer)0x0);
      }
    }
    bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->GlobalGenerator);
    if (!bVar3) {
      gname = cmMakefile::GetCMakeInstance
                        ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                         Makefile);
      psVar7 = cmValue::operator*[abi_cxx11_(&local_70);
      cmake::CreateGlobalGenerator((cmake *)((long)&e.field_2 + 8),(string *)gname,SUB81(psVar7,0));
      std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::operator=
                (&this->GlobalGenerator,
                 (unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
                 ((long)&e.field_2 + 8));
      std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
                ((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
                 ((long)&e.field_2 + 8));
      bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->GlobalGenerator);
      if (!bVar3) {
        cmAlphaNum::cmAlphaNum(&local_200,"could not create generator named \"");
        psVar7 = cmValue::operator*[abi_cxx11_(&local_70);
        cmAlphaNum::cmAlphaNum(&local_230,psVar7);
        dir.field_2._M_local_buf[0xf] = '\"';
        cmStrCat<char>((string *)local_1d0,&local_200,&local_230,dir.field_2._M_local_buf + 0xf);
        cmMakefile::IssueMessage
                  ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile
                   ,FATAL_ERROR,(string *)local_1d0);
        cmSystemTools::SetFatalErrorOccurred();
        this_local = (cmCTestBuildCommand *)0x0;
        dir.field_2._8_4_ = 1;
        std::__cxx11::string::~string((string *)local_1d0);
        goto LAB_00a3a848;
      }
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      std::__cxx11::string::operator=((string *)local_e8,"Debug");
    }
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"BuildDirectory",
               (allocator<char> *)(buildCommand.field_2._M_local_buf + 0xf));
    cmCTest::GetCTestConfiguration((string *)local_258,pcVar2,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator((allocator<char> *)(buildCommand.field_2._M_local_buf + 0xf));
    pcVar5 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::operator->
                       (&this->GlobalGenerator);
    native = local_108;
    psVar7 = local_148;
    bVar3 = cmMakefile::IgnoreErrorsCMP0061
                      ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                       Makefile);
    cmGlobalGenerator::GenerateCMakeBuildCommand
              ((string *)local_2a0,pcVar5,psVar7,(string *)local_e8,&this->ParallelLevel,native,
               bVar3);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
    poVar6 = std::operator<<((ostream *)local_418,"SetMakeCommand:");
    poVar6 = std::operator<<(poVar6,(string *)local_2a0);
    std::operator<<(poVar6,"\n");
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::__cxx11::ostringstream::str();
    msg = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildCommand.cxx"
                 ,0x6a,msg,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    std::__cxx11::string::~string(local_438);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_418);
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"MakeCommand",
               (string *)local_2a0,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    std::__cxx11::string::~string((string *)local_2a0);
    std::__cxx11::string::~string((string *)local_258);
    dir.field_2._8_4_ = 0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
    std::operator<<((ostream *)local_5b0,
                    "has no project to build. If this is a \"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR is set. Otherwise, set CTEST_BUILD_COMMAND to build the project with a custom command line."
                   );
    std::__cxx11::ostringstream::str();
    cmCommand::SetError((cmCommand *)this,(string *)&useLaunchers);
    std::__cxx11::string::~string((string *)&useLaunchers);
    this_local = (cmCTestBuildCommand *)0x0;
    dir.field_2._8_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
  }
LAB_00a3a848:
  std::__cxx11::string::~string((string *)local_e8);
  if (dir.field_2._8_4_ != 0) {
    return (cmCTestGenericHandler *)this_local;
  }
LAB_00a3a878:
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f8,"CTEST_USE_LAUNCHERS",
             (allocator<char> *)((long)&labelsForSubprojects.Value + 7));
  local_5d8 = cmMakefile::GetDefinition(pcVar1,&local_5f8);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&labelsForSubprojects.Value + 7));
  bVar3 = cmValue::operator_cast_to_bool(&local_5d8);
  if (bVar3) {
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    psVar7 = cmValue::operator*[abi_cxx11_(&local_5d8);
    cmCTest::SetCTestConfiguration
              (pcVar2,"UseLaunchers",psVar7,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_628,"CTEST_LABELS_FOR_SUBPROJECTS",&local_629);
  local_608 = cmMakefile::GetDefinition(pcVar1,&local_628);
  std::__cxx11::string::~string((string *)&local_628);
  std::allocator<char>::~allocator(&local_629);
  bVar3 = cmValue::operator_cast_to_bool(&local_608);
  if (bVar3) {
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    psVar7 = cmValue::operator*[abi_cxx11_(&local_608);
    cmCTest::SetCTestConfiguration
              (pcVar2,"LabelsForSubprojects",psVar7,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  }
  cmCTestGenericHandler::SetQuiet
            ((cmCTestGenericHandler *)ctestBuildCommand.Value,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  return (cmCTestGenericHandler *)ctestBuildCommand.Value;
}

Assistant:

cmCTestGenericHandler* cmCTestBuildCommand::InitializeHandler()
{
  cmCTestBuildHandler* handler = this->CTest->GetBuildHandler();
  handler->Initialize();

  this->Handler = handler;

  cmValue ctestBuildCommand =
    this->Makefile->GetDefinition("CTEST_BUILD_COMMAND");
  if (cmNonempty(ctestBuildCommand)) {
    this->CTest->SetCTestConfiguration("MakeCommand", *ctestBuildCommand,
                                       this->Quiet);
  } else {
    cmValue cmakeGeneratorName =
      this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR");

    // Build configuration is determined by: CONFIGURATION argument,
    // or CTEST_BUILD_CONFIGURATION script variable, or
    // CTEST_CONFIGURATION_TYPE script variable, or ctest -C command
    // line argument... in that order.
    //
    cmValue ctestBuildConfiguration =
      this->Makefile->GetDefinition("CTEST_BUILD_CONFIGURATION");
    std::string cmakeBuildConfiguration = cmNonempty(this->Configuration)
      ? this->Configuration
      : cmNonempty(ctestBuildConfiguration) ? *ctestBuildConfiguration
                                            : this->CTest->GetConfigType();

    const std::string& cmakeBuildAdditionalFlags = cmNonempty(this->Flags)
      ? this->Flags
      : this->Makefile->GetSafeDefinition("CTEST_BUILD_FLAGS");
    const std::string& cmakeBuildTarget = cmNonempty(this->Target)
      ? this->Target
      : this->Makefile->GetSafeDefinition("CTEST_BUILD_TARGET");

    if (cmNonempty(cmakeGeneratorName)) {
      if (cmakeBuildConfiguration.empty()) {
        cmakeBuildConfiguration = "Release";
      }
      if (this->GlobalGenerator) {
        if (this->GlobalGenerator->GetName() != *cmakeGeneratorName) {
          this->GlobalGenerator.reset();
        }
      }
      if (!this->GlobalGenerator) {
        this->GlobalGenerator =
          this->Makefile->GetCMakeInstance()->CreateGlobalGenerator(
            *cmakeGeneratorName);
        if (!this->GlobalGenerator) {
          std::string e = cmStrCat("could not create generator named \"",
                                   *cmakeGeneratorName, '"');
          this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e);
          cmSystemTools::SetFatalErrorOccurred();
          return nullptr;
        }
      }
      if (cmakeBuildConfiguration.empty()) {
#ifdef CMAKE_INTDIR
        cmakeBuildConfiguration = CMAKE_INTDIR;
#else
        cmakeBuildConfiguration = "Debug";
#endif
      }

      std::string dir = this->CTest->GetCTestConfiguration("BuildDirectory");
      std::string buildCommand =
        this->GlobalGenerator->GenerateCMakeBuildCommand(
          cmakeBuildTarget, cmakeBuildConfiguration, this->ParallelLevel,
          cmakeBuildAdditionalFlags, this->Makefile->IgnoreErrorsCMP0061());
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "SetMakeCommand:" << buildCommand << "\n",
                         this->Quiet);
      this->CTest->SetCTestConfiguration("MakeCommand", buildCommand,
                                         this->Quiet);
    } else {
      std::ostringstream ostr;
      /* clang-format off */
      ostr << "has no project to build. If this is a "
        "\"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR "
        "is set. Otherwise, set CTEST_BUILD_COMMAND to build the project "
        "with a custom command line.";
      /* clang-format on */
      this->SetError(ostr.str());
      return nullptr;
    }
  }

  if (cmValue useLaunchers =
        this->Makefile->GetDefinition("CTEST_USE_LAUNCHERS")) {
    this->CTest->SetCTestConfiguration("UseLaunchers", *useLaunchers,
                                       this->Quiet);
  }

  if (cmValue labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       *labelsForSubprojects, this->Quiet);
  }

  handler->SetQuiet(this->Quiet);
  return handler;
}